

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

bool __thiscall
units::uncertain_measurement::operator==(uncertain_measurement *this,measurement *other)

{
  float val2;
  double dVar1;
  bool local_32;
  bool local_31;
  float val;
  measurement *other_local;
  uncertain_measurement *this_local;
  
  dVar1 = measurement::value_as(other,&this->units_);
  val2 = (float)dVar1;
  if ((this->uncertainty_ != 0.0) || (NAN(this->uncertainty_))) {
    local_32 = false;
    if (this->value_ - this->uncertainty_ <= val2) {
      local_32 = val2 <= this->value_ + this->uncertainty_;
    }
    this_local._7_1_ = local_32;
  }
  else {
    if ((this->value_ != val2) || (NAN(this->value_) || NAN(val2))) {
      local_31 = detail::compare_round_equals(this->value_,val2);
    }
    else {
      local_31 = true;
    }
    this_local._7_1_ = local_31;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const measurement& other) const
    {
        auto val = static_cast<float>(other.value_as(units_));
        if (uncertainty_ == 0.0F) {
            return (value_ == val) ? true :
                                     detail::compare_round_equals(value_, val);
        }
        return (
            val >= (value_ - uncertainty_) && val <= (value_ + uncertainty_));
    }